

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O3

void crnlib::image_utils::convert_image(image_u8 *img,conversion_type conv_type)

{
  color_quad<unsigned_char,_int> *pcVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int y;
  int b;
  uint uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  uint y_00;
  uint uVar9;
  uint x;
  uint uVar10;
  byte bVar11;
  int iVar12;
  bool bVar13;
  
  switch(conv_type) {
  case cConversion_To_CCxY:
    img->m_comp_flags = 0x4b;
    break;
  case cConversion_From_CCxY:
    img->m_comp_flags = 7;
    break;
  case cConversion_To_xGxR:
    img->m_comp_flags = 0x2a;
    break;
  case cConversion_From_xGxR:
  case cConversion_From_xGBR:
  case cConversion_XY_to_XYZ:
    img->m_comp_flags = 0x27;
    break;
  case cConversion_To_xGBR:
    img->m_comp_flags = 0x2e;
    break;
  case cConversion_To_AGBR:
  case cConversion_From_AGBR:
    img->m_comp_flags = 0x2f;
    break;
  case cConversion_Y_To_A:
    *(byte *)&img->m_comp_flags = (byte)img->m_comp_flags | 8;
    break;
  case cConversion_A_To_RGBA:
    img->m_comp_flags = 0xf;
    break;
  case cConversion_Y_To_RGB:
    img->m_comp_flags = img->m_comp_flags & 8 | 0x17;
    break;
  case cConversion_To_Y:
    *(byte *)&img->m_comp_flags = (byte)img->m_comp_flags | 0x10;
    break;
  default:
    goto switchD_0011b59b_default;
  }
  uVar10 = img->m_height;
  if (uVar10 != 0) {
    uVar9 = img->m_width;
    uVar8 = 0;
    do {
      bVar13 = uVar9 != 0;
      uVar9 = 0;
      if (bVar13) {
        uVar10 = 0;
        do {
          pcVar1 = img->m_pPixels;
          uVar5 = img->m_pitch * uVar8 + uVar10;
          bVar2 = pcVar1[uVar5].field_0.field_0.r;
          bVar6 = pcVar1[uVar5].field_0.field_0.g;
          bVar3 = pcVar1[uVar5].field_0.field_0.b;
          uVar9 = (uint)bVar3;
          bVar4 = pcVar1[uVar5].field_0.field_0.a;
          bVar11 = bVar2;
          if (0xc < (uint)conv_type) goto LAB_0011b821;
          x = (uint)bVar2;
          y_00 = (uint)bVar6;
          uVar5 = (uint)bVar4;
          switch(conv_type) {
          case cConversion_To_CCxY:
            uVar9 = (uint)bVar3;
            iVar12 = (int)(uVar9 * 0x8000 + 0x8000 + y_00 * -0x54cd + x * -0x2b33) >> 0x10;
            if (iVar12 < -0x7a) {
              iVar12 = -0x7b;
            }
            iVar7 = (int)(uVar9 * -0x14d1 + 0x8000 + y_00 * -0x6b2f + (uint)bVar2 * 0x8000) >> 0x10;
            if (iVar7 < -0x7c) {
              iVar7 = -0x7d;
            }
            bVar4 = (byte)(uVar9 * 0x1d2f + 0x8000 + y_00 * 0x9646 + x * 0x4c8b >> 0x10);
            bVar6 = (char)iVar7 + 0x7d;
            bVar3 = 0;
            bVar11 = (char)iVar12 + 0x7b;
            break;
          case cConversion_From_CCxY:
            iVar12 = ((int)(y_00 * 0x166e9 + -0xaebfc5) >> 0x10) + uVar5;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            if (0xfe < iVar12) {
              iVar12 = 0xff;
            }
            bVar4 = (byte)iVar12;
            iVar12 = ((int)(y_00 * -0xb6d2 + x * -0x581a + 0x841908) >> 0x10) + uVar5;
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            if (0xfe < iVar12) {
              iVar12 = 0xff;
            }
            bVar6 = (byte)iVar12;
            uVar9 = ((int)(x * 0x1c5a2 + -0xd974d6) >> 0x10) + uVar5;
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            if (0xfe < (int)uVar9) {
              uVar9 = 0xff;
            }
          case cConversion_From_xGBR:
switchD_0011b66f_caseD_5:
            bVar3 = (byte)uVar9;
            bVar11 = bVar4;
            bVar4 = 0xff;
            break;
          case cConversion_To_xGxR:
            bVar3 = 0;
            bVar11 = 0;
            bVar4 = bVar2;
            break;
          case cConversion_From_xGxR:
            bVar2 = regen_z((uint)bVar4,y_00);
            uVar9 = (uint)bVar2;
            goto switchD_0011b66f_caseD_5;
          case cConversion_To_xGBR:
            bVar4 = 0;
          default:
            bVar11 = bVar4;
            bVar4 = bVar2;
            break;
          case cConversion_XY_to_XYZ:
            bVar3 = regen_z(x,y_00);
            bVar4 = 0xff;
            break;
          case cConversion_Y_To_A:
            bVar4 = (byte)((uint)bVar3 * 0x1d2f + y_00 * 0x9646 + x * 0x4c8b + 0x8000 >> 0x10);
            break;
          case cConversion_A_To_RGBA:
            bVar11 = bVar4;
            bVar6 = bVar4;
            bVar3 = bVar4;
            break;
          case cConversion_Y_To_RGB:
          case cConversion_To_Y:
            bVar11 = (byte)((uint)bVar3 * 0x1d2f + y_00 * 0x9646 + x * 0x4c8b + 0x8000 >> 0x10);
            bVar6 = bVar11;
            bVar3 = bVar11;
          }
LAB_0011b821:
          pcVar1 = img->m_pPixels;
          uVar9 = img->m_pitch * uVar8 + uVar10;
          pcVar1[uVar9].field_0.field_0.r = bVar11;
          pcVar1[uVar9].field_0.field_0.g = bVar6;
          pcVar1[uVar9].field_0.field_0.b = bVar3;
          pcVar1[uVar9].field_0.field_0.a = bVar4;
          uVar10 = uVar10 + 1;
          uVar9 = img->m_width;
        } while (uVar10 < uVar9);
        uVar10 = img->m_height;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar10);
  }
switchD_0011b59b_default:
  return;
}

Assistant:

void convert_image(image_u8& img, image_utils::conversion_type conv_type)
        {
            switch (conv_type)
            {
            case image_utils::cConversion_To_CCxY:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagLumaChroma));
                break;
            }
            case image_utils::cConversion_From_CCxY:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid));
                break;
            }
            case image_utils::cConversion_To_xGxR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_xGxR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_To_xGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_To_AGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_xGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_From_AGBR:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case image_utils::cConversion_XY_to_XYZ:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagNormalMap));
                break;
            }
            case cConversion_Y_To_A:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(img.get_comp_flags() | pixel_format_helpers::cCompFlagAValid));
                break;
            }
            case cConversion_A_To_RGBA:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagAValid));
                break;
            }
            case cConversion_Y_To_RGB:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(pixel_format_helpers::cCompFlagRValid | pixel_format_helpers::cCompFlagGValid | pixel_format_helpers::cCompFlagBValid | pixel_format_helpers::cCompFlagGrayscale | (img.has_alpha() ? pixel_format_helpers::cCompFlagAValid : 0)));
                break;
            }
            case cConversion_To_Y:
            {
                img.set_comp_flags(static_cast<pixel_format_helpers::component_flags>(img.get_comp_flags() | pixel_format_helpers::cCompFlagGrayscale));
                break;
            }
            default:
            {
                CRNLIB_ASSERT(false);
                return;
            }
            }

            for (uint y = 0; y < img.get_height(); y++)
            {
                for (uint x = 0; x < img.get_width(); x++)
                {
                    color_quad_u8 src(img(x, y));
                    color_quad_u8 dst;

                    switch (conv_type)
                    {
                    case image_utils::cConversion_To_CCxY:
                    {
                        color::RGB_to_YCC(dst, src);
                        break;
                    }
                    case image_utils::cConversion_From_CCxY:
                    {
                        color::YCC_to_RGB(dst, src);
                        break;
                    }
                    case image_utils::cConversion_To_xGxR:
                    {
                        dst.r = 0;
                        dst.g = src.g;
                        dst.b = 0;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_From_xGxR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        // This is kinda iffy, we're assuming the image is a normal map here.
                        dst.b = regen_z(src.a, src.g);
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_To_xGBR:
                    {
                        dst.r = 0;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_To_AGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_From_xGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_From_AGBR:
                    {
                        dst.r = src.a;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = src.r;
                        break;
                    }
                    case image_utils::cConversion_XY_to_XYZ:
                    {
                        dst.r = src.r;
                        dst.g = src.g;
                        // This is kinda iffy, we're assuming the image is a normal map here.
                        dst.b = regen_z(src.r, src.g);
                        dst.a = 255;
                        break;
                    }
                    case image_utils::cConversion_Y_To_A:
                    {
                        dst.r = src.r;
                        dst.g = src.g;
                        dst.b = src.b;
                        dst.a = static_cast<uint8>(src.get_luma());
                        break;
                    }
                    case image_utils::cConversion_Y_To_RGB:
                    {
                        uint8 y = static_cast<uint8>(src.get_luma());
                        dst.r = y;
                        dst.g = y;
                        dst.b = y;
                        dst.a = src.a;
                        break;
                    }
                    case image_utils::cConversion_A_To_RGBA:
                    {
                        dst.r = src.a;
                        dst.g = src.a;
                        dst.b = src.a;
                        dst.a = src.a;
                        break;
                    }
                    case image_utils::cConversion_To_Y:
                    {
                        uint8 y = static_cast<uint8>(src.get_luma());
                        dst.r = y;
                        dst.g = y;
                        dst.b = y;
                        dst.a = src.a;
                        break;
                    }
                    default:
                    {
                        CRNLIB_ASSERT(false);
                        dst = src;
                        break;
                    }
                    }

                    img(x, y) = dst;
                }
            }
        }